

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::CastFromBlobToBit>>
               (string_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  undefined8 uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  idx_t idx_in_entry;
  ulong uVar10;
  char **ppcVar11;
  string_t input;
  string_t sVar12;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ValidityMask *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = sel_vector->sel_vector;
      ppcVar11 = &(result_data->value).pointer.ptr;
      uVar10 = 0;
      do {
        uVar6 = uVar10;
        if (psVar2 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar2[uVar10];
        }
        sVar12.value.pointer.ptr = ldata[uVar6].value.pointer.ptr;
        sVar12.value._0_8_ = *(undefined8 *)&ldata[uVar6].value;
        sVar12 = CastFromBlobToBit::Operation<duckdb::string_t>(sVar12,(Vector *)dataptr);
        uVar7 = sVar12.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
        paVar1->length = (int)uVar7;
        paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
        *ppcVar11 = sVar12.value._8_8_;
        uVar10 = uVar10 + 1;
        ppcVar11 = ppcVar11 + 2;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar2 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    ppcVar11 = &(result_data->value).pointer.ptr;
    uVar10 = 0;
    local_40 = mask;
    do {
      uVar6 = uVar10;
      if (psVar2 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar2[uVar10];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) == 0) {
        _Var9._M_head_impl = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
        ;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var9._M_head_impl;
          mask = local_40;
        }
        bVar3 = (byte)uVar10 & 0x3f;
        _Var9._M_head_impl[uVar10 >> 6] =
             _Var9._M_head_impl[uVar10 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        input.value.pointer.ptr = ldata[uVar6].value.pointer.ptr;
        input.value._0_8_ = *(undefined8 *)&ldata[uVar6].value;
        sVar12 = CastFromBlobToBit::Operation<duckdb::string_t>(input,(Vector *)dataptr);
        uVar7 = sVar12.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
        paVar1->length = (int)uVar7;
        paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
        *ppcVar11 = sVar12.value._8_8_;
      }
      uVar10 = uVar10 + 1;
      ppcVar11 = ppcVar11 + 2;
    } while (count != uVar10);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}